

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

void col_sort_int(int *integers,int *cols,int N)

{
  void *__base;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  int i;
  str_int *objects;
  int local_28;
  int local_24;
  undefined8 in_stack_ffffffffffffffe0;
  
  __base = chk_alloc((uint)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                     (uint)in_stack_ffffffffffffffe0);
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    *(undefined4 *)((long)__base + (long)local_24 * 8) =
         *(undefined4 *)(in_RDI + (long)local_24 * 4);
    *(int *)((long)__base + (long)local_24 * 8 + 4) = local_24;
  }
  qsort(__base,(long)in_EDX,8,cmp_int);
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    *(undefined4 *)(in_RSI + (long)local_28 * 4) =
         *(undefined4 *)((long)__base + (long)local_28 * 8 + 4);
  }
  free(__base);
  return;
}

Assistant:

void col_sort_int(int *integers,int *cols, int N){
    struct str_int *objects;
    objects=chk_alloc (N, sizeof *objects);
    for (int i = 0; i < N; i++)
    {
        objects[i].value = integers[i];
        objects[i].index = i;
    }
    //sort objects array according to value using qsort
    qsort(objects, N, sizeof(objects[0]), cmp_int);
    for (int i = 0; i < N; i++)
        cols[i]=objects[i].index;

    free(objects);

}